

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SerialSettings.cpp
# Opt level: O3

void __thiscall
axl::io::SerialSettings::setup
          (SerialSettings *this,uint_t baudRate,uint_t dataBits,SerialStopBits stopBits,
          SerialParity parity,SerialFlowControl flowControl,uint_t readInterval,bool dtr,bool rts)

{
  bool in_stack_00000010;
  bool in_stack_00000018;
  
  this->m_baudRate = baudRate;
  this->m_dataBits = dataBits;
  this->m_stopBits = stopBits;
  this->m_parity = parity;
  this->m_flowControl = flowControl;
  this->m_readInterval = readInterval;
  this->m_dtr = in_stack_00000010;
  this->m_rts = in_stack_00000018;
  return;
}

Assistant:

void
SerialSettings::setup(
	uint_t baudRate,
	uint_t dataBits,
	SerialStopBits stopBits,
	SerialParity parity,
	SerialFlowControl flowControl,
	uint_t readInterval,
	bool dtr,
	bool rts
) {
	m_baudRate = baudRate;
	m_dataBits = dataBits;
	m_stopBits = stopBits;
	m_parity = parity;
	m_flowControl = flowControl;
	m_readInterval = readInterval;
	m_dtr = dtr;
	m_rts = rts;
}